

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O3

ze_result_t loader::zetMetricStreamerClose(zet_metric_streamer_handle_t hMetricStreamer)

{
  _zet_metric_streamer_handle_t *_key;
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hMetricStreamer + 8) + 0x7b8) == (code *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_zet_metric_streamer_handle_t **)hMetricStreamer;
    zVar1 = (**(code **)(*(long *)(hMetricStreamer + 8) + 0x7b8))(_key);
    if (zVar1 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_zet_metric_streamer_handle_t_*>,__zet_metric_streamer_handle_t_*>
      ::release((singleton_factory_t<object_t<_zet_metric_streamer_handle_t_*>,__zet_metric_streamer_handle_t_*>
                 *)(context + 0x1380),_key);
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerClose(
        zet_metric_streamer_handle_t hMetricStreamer    ///< [in][release] handle of the metric streamer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_streamer_object_t*>( hMetricStreamer )->dditable;
        auto pfnClose = dditable->zet.MetricStreamer.pfnClose;
        if( nullptr == pfnClose )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricStreamer = reinterpret_cast<zet_metric_streamer_object_t*>( hMetricStreamer )->handle;

        // forward to device-driver
        result = pfnClose( hMetricStreamer );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->zet_metric_streamer_factory.release( hMetricStreamer );

        return result;
    }